

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

void __thiscall CLabelTable::Dump(CLabelTable *this)

{
  char *pcVar1;
  char cVar2;
  FILE *__stream;
  mapped_type *pmVar3;
  size_t sVar4;
  key_type *name;
  key_type *__k;
  char *ep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  order;
  char line [2048];
  char *local_858;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_850;
  undefined2 local_838;
  char local_836 [2044];
  undefined1 local_3a [10];
  
  __stream = (FILE *)GetListingFile();
  if (__stream != (FILE *)0x0) {
    getDumpOrder(&local_850,&this->symbols);
    fputs("\nValue    Label\n",__stream);
    fputs("------ - -----------------------------------------------------------\n",__stream);
    for (__k = local_850.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __k != local_850.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
               ::at(&this->symbols,__k);
      if (pmVar3->page != -1) {
        local_838 = 0x7830;
        local_858 = local_836;
        PrintHexAlt(&local_858,pmVar3->value);
        pcVar1 = local_858 + 1;
        *local_858 = ' ';
        local_858 = pcVar1;
        cVar2 = 'X';
        if (pmVar3->used != false) {
          cVar2 = ' ';
        }
        pcVar1 = local_858 + 1;
        *local_858 = cVar2;
        local_858 = pcVar1;
        pcVar1 = local_858 + 1;
        *local_858 = ' ';
        local_858 = pcVar1;
        strncpy(local_858,(__k->_M_dataplus)._M_p,(size_t)(local_3a + -(long)local_858));
        pcVar1 = local_858;
        sVar4 = strlen(local_858);
        (pcVar1 + sVar4)[0] = '\n';
        (pcVar1 + sVar4)[1] = '\0';
        fputs((char *)&local_838,__stream);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_850);
  }
  return;
}

Assistant:

void CLabelTable::Dump() {
	FILE* listFile = GetListingFile();
	if (NULL == listFile) return;		// listing file must be already opened here

	const auto order = getDumpOrder(symbols);

	char line[LINEMAX], *ep;
	fputs("\nValue    Label\n", listFile);
	fputs("------ - -----------------------------------------------------------\n", listFile);
	for (const symbol_map_t::key_type& name: order) {
		const symbol_map_t::mapped_type& symbol = symbols.at(name);
		if (LABEL_PAGE_UNDEFINED == symbol.page) continue;
		ep = line;
		*(ep) = 0;
		*(ep++) = '0';
		*(ep++) = 'x';
		PrintHexAlt(ep, symbol.value);
		*(ep++) = ' ';
		*(ep++) = symbol.used ? ' ' : 'X';
		*(ep++) = ' ';
		STRNCPY(ep, LINEMAX, name.c_str(), LINEMAX - (ep - line) - 2);
		STRNCAT(ep, LINEMAX, "\n", 2);
		fputs(line, listFile);
	}
}